

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

time_t ns_mgr_poll(ns_mgr *mgr,int milli)

{
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__dest;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  ssize_t sVar8;
  ns_connection *nc_00;
  sockaddr *p;
  ns_connection *pnVar9;
  ns_connection *pnVar10;
  int iVar11;
  ulong uVar12;
  time_t current_time;
  int n;
  fd_set read_set;
  ns_connection nc;
  fd_set write_set;
  timeval tv;
  ctl_msg ctl_msg;
  time_t local_21f8;
  socklen_t local_21f0;
  undefined1 local_21ec [12];
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  ns_connection local_2168;
  fd_set local_20c8;
  timeval local_2048;
  sockaddr local_2038 [512];
  
  local_21f8 = time((time_t *)0x0);
  local_21ec[4] = '\0';
  local_21ec[5] = '\0';
  local_21ec[6] = '\0';
  local_21ec[7] = '\0';
  local_21ec[8] = '\0';
  local_21ec[9] = '\0';
  local_21ec[10] = '\0';
  local_21ec[0xb] = '\0';
  uStack_21e0 = 0;
  local_21d8 = 0;
  uStack_21d0 = 0;
  local_21c8 = 0;
  uStack_21c0 = 0;
  local_21b8 = 0;
  uStack_21b0 = 0;
  local_21a8 = 0;
  uStack_21a0 = 0;
  local_2198 = 0;
  uStack_2190 = 0;
  local_2188 = 0;
  uStack_2180 = 0;
  local_2178 = 0;
  uStack_2170 = 0;
  local_20c8.fds_bits[0] = 0;
  local_20c8.fds_bits[1] = 0;
  local_20c8.fds_bits[2] = 0;
  local_20c8.fds_bits[3] = 0;
  local_20c8.fds_bits[4] = 0;
  local_20c8.fds_bits[5] = 0;
  local_20c8.fds_bits[6] = 0;
  local_20c8.fds_bits[7] = 0;
  local_20c8.fds_bits[8] = 0;
  local_20c8.fds_bits[9] = 0;
  local_20c8.fds_bits[10] = 0;
  local_20c8.fds_bits[0xb] = 0;
  local_20c8.fds_bits[0xc] = 0;
  local_20c8.fds_bits[0xd] = 0;
  local_20c8.fds_bits[0xe] = 0;
  local_20c8.fds_bits[0xf] = 0;
  iVar6 = mgr->ctl[1];
  if (iVar6 == -1) {
    iVar6 = -1;
  }
  else {
    iVar11 = iVar6 + 0x3f;
    if (-1 < iVar6) {
      iVar11 = iVar6;
    }
    *(ulong *)(local_21ec + (long)(iVar11 >> 6) * 8 + 4) =
         *(ulong *)(local_21ec + (long)(iVar11 >> 6) * 8 + 4) | 1L << ((byte)iVar6 & 0x3f);
  }
  pnVar10 = mgr->active_connections;
  while (pnVar9 = pnVar10, pnVar9 != (ns_connection *)0x0) {
    pnVar10 = pnVar9->next;
    if ((pnVar9->flags & 0x88) == 0) {
      (*pnVar9->callback)(pnVar9,0,&local_21f8);
    }
    uVar2 = pnVar9->flags;
    iVar11 = iVar6;
    if (((uVar2 & 0x40) == 0) && (iVar3 = pnVar9->sock, iVar3 != -1)) {
      iVar11 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar11 = iVar3;
      }
      *(ulong *)(local_21ec + (long)(iVar11 >> 6) * 8 + 4) =
           *(ulong *)(local_21ec + (long)(iVar11 >> 6) * 8 + 4) | 1L << ((byte)iVar3 & 0x3f);
      iVar11 = iVar3;
      if (iVar3 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar6 == -1) {
        iVar11 = iVar3;
      }
    }
    iVar6 = iVar11;
    if ((((uVar2 & 0x28) == 8) || (((uVar2 & 10) == 0 && ((pnVar9->send_iobuf).len != 0)))) &&
       (iVar3 = pnVar9->sock, iVar3 != -1)) {
      iVar6 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      local_20c8.fds_bits[iVar6 >> 6] = local_20c8.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar3 & 0x3f)
      ;
      iVar6 = iVar3;
      if (iVar3 < iVar11) {
        iVar6 = iVar11;
      }
      if (iVar11 == -1) {
        iVar6 = iVar3;
      }
    }
    if ((uVar2 & 0x10) != 0) {
      ns_close_conn(pnVar9);
    }
  }
  local_2048.tv_sec = (__time_t)(milli / 1000);
  local_2048.tv_usec = (__suseconds_t)((milli % 1000) * 1000);
  iVar6 = select(iVar6 + 1,(fd_set *)(local_21ec + 4),&local_20c8,(fd_set *)0x0,&local_2048);
  if (0 < iVar6) {
    local_21f8 = time((time_t *)0x0);
    uVar2 = mgr->ctl[1];
    if (uVar2 != 0xffffffff) {
      uVar7 = uVar2 + 0x3f;
      if (-1 < (int)uVar2) {
        uVar7 = uVar2;
      }
      if ((*(ulong *)(local_21ec + (long)((int)uVar7 >> 6) * 8 + 4) >> ((ulong)uVar2 & 0x3f) & 1) !=
          0) {
        sVar8 = recv(uVar2,local_2038,0x2008,0);
        send(mgr->ctl[1],local_2038[0].sa_data + 6,1,0);
        if ((7 < (int)sVar8) && (CONCAT44(local_2038[0].sa_data._2_4_,local_2038[0]._0_4_) != 0)) {
          for (pnVar10 = mgr->active_connections; pnVar10 != (ns_connection *)0x0;
              pnVar10 = pnVar10->next) {
            (*(code *)CONCAT44(local_2038[0].sa_data._2_4_,local_2038[0]._0_4_))
                      (pnVar10,0,local_2038[0].sa_data + 6);
          }
        }
      }
    }
    if (mgr->active_connections != (ns_connection *)0x0) {
      pnVar10 = mgr->active_connections;
      do {
        pnVar9 = pnVar10->next;
        uVar2 = pnVar10->sock;
        uVar7 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar7 = uVar2;
        }
        if ((*(ulong *)(local_21ec + (long)((int)uVar7 >> 6) * 8 + 4) >> ((ulong)uVar2 & 0x3f) & 1)
            != 0) {
          if ((char)pnVar10->flags < '\0') {
            if ((pnVar10->flags >> 8 & 1) == 0) {
              local_2168.next._0_4_ = 0x10;
              iVar6 = accept(uVar2,local_2038,(socklen_t *)&local_2168);
              if (iVar6 != -1) {
                nc_00 = ns_add_sock(pnVar10->mgr,iVar6,pnVar10->callback,pnVar10->user_data);
                if (nc_00 != (ns_connection *)0x0) {
                  nc_00->listener = pnVar10;
                  nc_00->proto_data = pnVar10->proto_data;
                  iVar6 = 1;
                  p = local_2038;
                  goto LAB_0010585b;
                }
                close(iVar6);
              }
            }
            else {
              local_21f0 = 0x10;
              memset(&local_2168,0,0xa0);
              sVar8 = recvfrom(pnVar10->sock,local_2038,2000,0,(sockaddr *)&local_2168.sa.sa,
                               &local_21f0);
              local_21ec._0_4_ = (undefined4)sVar8;
              if (0 < (int)local_21ec._0_4_) {
                local_2168.mgr = pnVar10->mgr;
                local_2168.recv_iobuf.len = (size_t)(local_21ec._0_4_ & 0x7fffffff);
                local_2168.sock = pnVar10->sock;
                local_2168.callback = pnVar10->callback;
                local_2168.user_data = pnVar10->user_data;
                local_2168.proto_data = pnVar10->proto_data;
                local_2168.flags = 0x100;
                iVar6 = 3;
                p = (sockaddr *)local_21ec;
                nc_00 = &local_2168;
                local_2168.listener = pnVar10;
                local_2168.recv_iobuf.buf = (char *)local_2038;
                local_2168.recv_iobuf.size = local_2168.recv_iobuf.len;
LAB_0010585b:
                ns_call(nc_00,iVar6,p);
              }
            }
          }
          else {
            pnVar10->last_io_time = local_21f8;
            ns_read_from_socket(pnVar10);
          }
        }
        uVar2 = pnVar10->sock;
        uVar7 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar7 = uVar2;
        }
        if (((ulong)local_20c8.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          if ((pnVar10->flags & 8) == 0) {
            if ((pnVar10->flags & 2) == 0) {
              pnVar10->last_io_time = local_21f8;
              local_2038[0].sa_family = 0;
              local_2038[0].sa_data[0] = '\0';
              local_2038[0].sa_data[1] = '\0';
              sVar8 = send(uVar2,(pnVar10->send_iobuf).buf,(pnVar10->send_iobuf).len,0);
              local_2038[0]._0_4_ = (undefined4)sVar8;
              ns_call(pnVar10,4,local_2038);
              uVar5 = local_2038[0]._0_4_;
              uVar12 = (ulong)(uint)local_2038[0]._0_4_;
              iVar6 = ns_is_error(local_2038[0]._0_4_);
              if (iVar6 == 0) {
                if ((0 < (int)uVar5) && (uVar4 = (pnVar10->send_iobuf).len, uVar12 <= uVar4)) {
                  __dest = (pnVar10->send_iobuf).buf;
                  memmove(__dest,__dest + uVar12,uVar4 - uVar12);
                  psVar1 = &(pnVar10->send_iobuf).len;
                  *psVar1 = *psVar1 - uVar12;
                }
              }
              else {
                *(byte *)&pnVar10->flags = (byte)pnVar10->flags | 0x10;
              }
            }
          }
          else {
            ns_read_from_socket(pnVar10);
          }
        }
        pnVar10 = pnVar9;
      } while (pnVar9 != (ns_connection *)0x0);
    }
  }
  pnVar10 = mgr->active_connections;
  while (pnVar9 = pnVar10, pnVar9 != (ns_connection *)0x0) {
    pnVar10 = pnVar9->next;
    if (((pnVar9->flags & 0x10) != 0) ||
       (((pnVar9->flags & 1) != 0 && ((pnVar9->send_iobuf).len == 0)))) {
      ns_close_conn(pnVar9);
    }
  }
  return local_21f8;
}

Assistant:

time_t ns_mgr_poll(struct ns_mgr *mgr, int milli) {
  struct ns_connection *conn, *tmp_conn;
  struct timeval tv;
  fd_set read_set, write_set;
  sock_t max_fd = INVALID_SOCKET;
  time_t current_time = time(NULL);

  FD_ZERO(&read_set);
  FD_ZERO(&write_set);
  ns_add_to_set(mgr->ctl[1], &read_set, &max_fd);

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if (!(conn->flags & (NSF_LISTENING | NSF_CONNECTING))) {
      ns_call(conn, NS_POLL, &current_time);
    }
    if (!(conn->flags & NSF_WANT_WRITE)) {
      //DBG(("%p read_set", conn));
      ns_add_to_set(conn->sock, &read_set, &max_fd);
    }
    if (((conn->flags & NSF_CONNECTING) && !(conn->flags & NSF_WANT_READ)) ||
        (conn->send_iobuf.len > 0 && !(conn->flags & NSF_CONNECTING) &&
         !(conn->flags & NSF_BUFFER_BUT_DONT_SEND))) {
      //DBG(("%p write_set", conn));
      ns_add_to_set(conn->sock, &write_set, &max_fd);
    }
    if (conn->flags & NSF_CLOSE_IMMEDIATELY) {
      ns_close_conn(conn);
    }
  }

  tv.tv_sec = milli / 1000;
  tv.tv_usec = (milli % 1000) * 1000;

  if (select((int) max_fd + 1, &read_set, &write_set, NULL, &tv) > 0) {
    // select() might have been waiting for a long time, reset current_time
    // now to prevent last_io_time being set to the past.
    current_time = time(NULL);

    // Read wakeup messages
    if (mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
      struct ctl_msg ctl_msg;
      int len = (int) recv(mgr->ctl[1], (char *) &ctl_msg, sizeof(ctl_msg), 0);
      send(mgr->ctl[1], ctl_msg.message, 1, 0);
      if (len >= (int) sizeof(ctl_msg.callback) && ctl_msg.callback != NULL) {
        struct ns_connection *c;
        for (c = ns_next(mgr, NULL); c != NULL; c = ns_next(mgr, c)) {
          ctl_msg.callback(c, NS_POLL, ctl_msg.message);
        }
      }
    }

    for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
      tmp_conn = conn->next;
      if (FD_ISSET(conn->sock, &read_set)) {
        if (conn->flags & NSF_LISTENING) {
          if (conn->flags & NSF_UDP) {
            ns_handle_udp(conn);
          } else {
            // We're not looping here, and accepting just one connection at
            // a time. The reason is that eCos does not respect non-blocking
            // flag on a listening socket and hangs in a loop.
            accept_conn(conn);
          }
        } else {
          conn->last_io_time = current_time;
          ns_read_from_socket(conn);
        }
      }

      if (FD_ISSET(conn->sock, &write_set)) {
        if (conn->flags & NSF_CONNECTING) {
          ns_read_from_socket(conn);
        } else if (!(conn->flags & NSF_BUFFER_BUT_DONT_SEND)) {
          conn->last_io_time = current_time;
          ns_write_to_socket(conn);
        }
      }
    }
  }

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if ((conn->flags & NSF_CLOSE_IMMEDIATELY) ||
        (conn->send_iobuf.len == 0 &&
          (conn->flags & NSF_FINISHED_SENDING_DATA))) {
      ns_close_conn(conn);
    }
  }

  return current_time;
}